

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O1

ER __thiscall
slang::ast::DoWhileLoopStatement::evalImpl(DoWhileLoopStatement *this,EvalContext *context)

{
  bool bVar1;
  ER EVar2;
  ER unaff_EBX;
  char cVar3;
  ConstantValue cv;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_50;
  
  do {
    EVar2 = Statement::eval(this->body,context);
    if (EVar2 == Success) {
LAB_0043a084:
      Expression::eval((ConstantValue *)&local_50,this->cond,context);
      if (local_50._M_index == '\0') {
        unaff_EBX = Fail;
        cVar3 = '\x01';
      }
      else {
        bVar1 = ConstantValue::isTrue((ConstantValue *)&local_50);
        cVar3 = !bVar1 * '\x03';
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_50);
    }
    else if (EVar2 == Break) {
      cVar3 = '\x03';
    }
    else {
      if (EVar2 == Continue) goto LAB_0043a084;
      cVar3 = '\x01';
      unaff_EBX = EVar2;
    }
    if (cVar3 != '\0') {
      if (cVar3 != '\x01') {
        unaff_EBX = Success;
      }
      return unaff_EBX;
    }
  } while( true );
}

Assistant:

ER DoWhileLoopStatement::evalImpl(EvalContext& context) const {
    while (true) {
        ER result = body.eval(context);
        if (result != ER::Success) {
            if (result == ER::Break)
                break;
            else if (result != ER::Continue)
                return result;
        }

        auto cv = cond.eval(context);
        if (cv.bad())
            return ER::Fail;

        if (!cv.isTrue())
            break;
    }

    return ER::Success;
}